

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O2

int freehand(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = 1;
  uVar3 = uVar1;
  if ((((uwep != (obj *)0x0) && (iVar2 = welded(uwep), iVar2 != 0)) &&
      (((byte)(uwep->oclass | 4U) != 6 || (uVar3 = 0, (objects[uwep->otyp].field_0x11 & 1) == 0))))
     && (uVar3 = uVar1, uarms != (obj *)0x0)) {
    uVar3 = ~*(uint *)&uarms->field_0x4a & 1;
  }
  return uVar3;
}

Assistant:

int freehand(void)
{
	return(!uwep || !welded(uwep) ||
	   (!bimanual(uwep) && (!uarms || !uarms->cursed)));
/*	if ((uwep && bimanual(uwep)) ||
	    (uwep && uarms))
		return 0;
	else
		return 1;*/
}